

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int run_container_to_uint32_array(void *vout,run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t val;
  int j;
  uint16_t le;
  uint32_t run_start;
  int i;
  uint32_t *out;
  int outpos;
  uint32_t base_local;
  run_container_t *cont_local;
  void *vout_local;
  
  outpos = 0;
  for (i = 0; i < cont->n_runs; i = i + 1) {
    uVar1 = cont->runs[i].value;
    uVar2 = cont->runs[i].length;
    for (j = 0; j <= (int)(uint)uVar2; j = j + 1) {
      *(uint32_t *)((long)vout + (long)outpos * 4) = base + uVar1 + j;
      outpos = outpos + 1;
    }
  }
  return outpos;
}

Assistant:

ALLOW_UNALIGNED
int run_container_to_uint32_array(void *vout, const run_container_t *cont,
                                  uint32_t base) {
    int outpos = 0;
    uint32_t *out = (uint32_t *)vout;
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (int j = 0; j <= le; ++j) {
            uint32_t val = run_start + j;
            memcpy(out + outpos, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            outpos++;
        }
    }
    return outpos;
}